

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O1

QPointF roundInDeviceCoordinates(QPointF *p,QTransform *m)

{
  long in_FS_OFFSET;
  undefined1 auVar1 [16];
  QPointF QVar2;
  QPointF local_88;
  QTransform local_70;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QTransform::inverted(&local_70,m,(bool *)0x0);
  QVar2 = QTransform::map(m,p);
  auVar1._0_8_ = (double)((ulong)QVar2.xp & 0x8000000000000000 | 0x3fe0000000000000) + QVar2.xp;
  auVar1._8_8_ = (double)((ulong)QVar2.yp & 0x8000000000000000 | 0x3fe0000000000000) + QVar2.yp;
  auVar1 = minpd(_DAT_00684790,auVar1);
  auVar1 = maxpd(auVar1,_DAT_006847a0);
  local_88.xp = (qreal)(int)auVar1._0_8_;
  local_88.yp = (qreal)(int)auVar1._8_8_;
  QVar2 = QTransform::map(&local_70,&local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

static inline QPointF roundInDeviceCoordinates(const QPointF &p, const QTransform &m)
{
    return m.inverted().map(QPointF(m.map(p).toPoint()));
}